

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void nite::print(int n)

{
  int in_EDX;
  string local_30;
  
  toStr_abi_cxx11_(&local_30,(nite *)(ulong)(uint)n,in_EDX);
  print(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void nite::print(int n){
	nite::print(nite::toStr(n));
}